

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

void __thiscall
spvtools::opt::IRContext::InvalidateAnalyses(IRContext *this,Analysis analyses_to_invalidate)

{
  Analysis local_14;
  IRContext *pIStack_10;
  Analysis analyses_to_invalidate_local;
  IRContext *this_local;
  
  local_14 = analyses_to_invalidate;
  pIStack_10 = this;
  if ((analyses_to_invalidate & kAnalysisTypes) != kAnalysisNone) {
    opt::operator|=(&local_14,kAnalysisConstants);
    opt::operator|=(&local_14,kAnalysisDebugInfo);
  }
  if ((local_14 & kAnalysisCFG) != kAnalysisNone) {
    opt::operator|=(&local_14,kAnalysisDominatorAnalysis);
  }
  if ((local_14 & kAnalysisBegin) != kAnalysisNone) {
    std::
    unique_ptr<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
    ::reset(&this->def_use_mgr_,(pointer)0x0);
  }
  if ((local_14 & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
    std::
    unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>_>
    ::clear(&this->instr_to_block_);
  }
  if ((local_14 & kAnalysisDecorations) != kAnalysisNone) {
    std::
    unique_ptr<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
    ::reset(&this->decoration_mgr_,(pointer)0x0);
  }
  if ((local_14 & kAnalysisCombinators) != kAnalysisNone) {
    std::
    unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
    ::clear(&this->combinator_ops_);
  }
  if ((local_14 & kAnalysisBuiltinVarId) != kAnalysisNone) {
    std::
    unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::clear(&this->builtin_var_id_map_);
  }
  if ((local_14 & kAnalysisCFG) != kAnalysisNone) {
    std::unique_ptr<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>::reset
              (&this->cfg_,(pointer)0x0);
  }
  if ((local_14 & kAnalysisDominatorAnalysis) != kAnalysisNone) {
    std::
    map<const_spvtools::opt::Function_*,_spvtools::opt::DominatorAnalysis,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>_>_>
    ::clear(&this->dominator_trees_);
    std::
    map<const_spvtools::opt::Function_*,_spvtools::opt::PostDominatorAnalysis,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>_>
    ::clear(&this->post_dominator_trees_);
  }
  if ((local_14 & kAnalysisNameMap) != kAnalysisNone) {
    std::
    unique_ptr<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
    ::reset(&this->id_to_name_,(pointer)0x0);
  }
  if ((local_14 & kAnalysisValueNumberTable) != kAnalysisNone) {
    std::
    unique_ptr<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
    ::reset(&this->vn_table_,(pointer)0x0);
  }
  if ((local_14 & kAnalysisStructuredCFG) != kAnalysisNone) {
    std::
    unique_ptr<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
    ::reset(&this->struct_cfg_analysis_,(pointer)0x0);
  }
  if ((local_14 & kAnalysisIdToFuncMapping) != kAnalysisNone) {
    std::
    unordered_map<unsigned_int,_spvtools::opt::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>_>
    ::clear(&this->id_to_func_);
  }
  if ((local_14 & kAnalysisConstants) != kAnalysisNone) {
    std::
    unique_ptr<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
    ::reset(&this->constant_mgr_,(pointer)0x0);
  }
  if ((local_14 & kAnalysisLiveness) != kAnalysisNone) {
    std::
    unique_ptr<spvtools::opt::analysis::LivenessManager,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
    ::reset(&this->liveness_mgr_,(pointer)0x0);
  }
  if ((local_14 & kAnalysisTypes) != kAnalysisNone) {
    std::
    unique_ptr<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
    ::reset(&this->type_mgr_,(pointer)0x0);
  }
  if ((local_14 & kAnalysisDebugInfo) != kAnalysisNone) {
    std::
    unique_ptr<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
    ::reset(&this->debug_info_mgr_,(pointer)0x0);
  }
  this->valid_analyses_ = this->valid_analyses_ & (local_14 ^ ~kAnalysisNone);
  return;
}

Assistant:

void IRContext::InvalidateAnalyses(IRContext::Analysis analyses_to_invalidate) {
  // The ConstantManager and DebugInfoManager contain Type pointers. If the
  // TypeManager goes away, the ConstantManager and DebugInfoManager have to
  // go away.
  if (analyses_to_invalidate & kAnalysisTypes) {
    analyses_to_invalidate |= kAnalysisConstants;
    analyses_to_invalidate |= kAnalysisDebugInfo;
  }

  // The dominator analysis hold the pseudo entry and exit nodes from the CFG.
  // Also if the CFG change the dominators many changed as well, so the
  // dominator analysis should be invalidated as well.
  if (analyses_to_invalidate & kAnalysisCFG) {
    analyses_to_invalidate |= kAnalysisDominatorAnalysis;
  }

  if (analyses_to_invalidate & kAnalysisDefUse) {
    def_use_mgr_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisInstrToBlockMapping) {
    instr_to_block_.clear();
  }
  if (analyses_to_invalidate & kAnalysisDecorations) {
    decoration_mgr_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisCombinators) {
    combinator_ops_.clear();
  }
  if (analyses_to_invalidate & kAnalysisBuiltinVarId) {
    builtin_var_id_map_.clear();
  }
  if (analyses_to_invalidate & kAnalysisCFG) {
    cfg_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisDominatorAnalysis) {
    dominator_trees_.clear();
    post_dominator_trees_.clear();
  }
  if (analyses_to_invalidate & kAnalysisNameMap) {
    id_to_name_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisValueNumberTable) {
    vn_table_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisStructuredCFG) {
    struct_cfg_analysis_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisIdToFuncMapping) {
    id_to_func_.clear();
  }
  if (analyses_to_invalidate & kAnalysisConstants) {
    constant_mgr_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisLiveness) {
    liveness_mgr_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisTypes) {
    type_mgr_.reset(nullptr);
  }

  if (analyses_to_invalidate & kAnalysisDebugInfo) {
    debug_info_mgr_.reset(nullptr);
  }

  valid_analyses_ = Analysis(valid_analyses_ & ~analyses_to_invalidate);
}